

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

void __thiscall SQVM::LeaveFrame(SQVM *this)

{
  SQTable *this_00;
  SQVM *this_01;
  SQObjectPtr *in_RDI;
  SQInteger css;
  SQInteger last_stackbase;
  SQInteger last_top;
  SQObjectPtr *in_stack_ffffffffffffffd0;
  long local_10;
  
  local_10 = in_RDI[4].super_SQObject._unVal.nInteger;
  this_01 = (SQVM *)(in_RDI[0xc].super_SQObject._unVal.nInteger + -1);
  in_RDI[0xc].super_SQObject._unVal.pThread = this_01;
  ::SQObjectPtr::Null(in_stack_ffffffffffffffd0);
  *(long *)&in_RDI[5].super_SQObject =
       *(long *)&in_RDI[5].super_SQObject -
       (long)*(int *)((long)&((in_RDI[0x10].super_SQObject._unVal.pTable)->super_SQDelegable).
                             super_SQCollectable._sharedstate + 4);
  in_RDI[4].super_SQObject._unVal.pTable =
       (SQTable *)
       (*(long *)&in_RDI[5].super_SQObject +
       (long)(int)((in_RDI[0x10].super_SQObject._unVal.pGenerator)->_closure).super_SQObject._type);
  if (this_01 == (SQVM *)0x0) {
    this_00 = (SQTable *)0x0;
  }
  else {
    this_00 = (SQTable *)
              (*(long *)&in_RDI[0xc].super_SQObject +
              (long)((long)&this_01[-1]._suspended_traps + 7) * 0x48);
  }
  in_RDI[0x10].super_SQObject._unVal.pTable = this_00;
  if (in_RDI[5].super_SQObject._unVal.pTable != (SQTable *)0x0) {
    CloseOuters(this_01,in_RDI);
  }
  while (in_RDI[4].super_SQObject._unVal.nInteger <= local_10) {
    local_10 = local_10 + -1;
    ::SQObjectPtr::Null((SQObjectPtr *)this_00);
  }
  return;
}

Assistant:

void SQVM::LeaveFrame() {
    SQInteger last_top = _top;
    SQInteger last_stackbase = _stackbase;
    SQInteger css = --_callsstacksize;

    /* First clean out the call stack frame */
    ci->_closure.Null();
    _stackbase -= ci->_prevstkbase;
    _top = _stackbase + ci->_prevtop;
    ci = (css) ? &_callsstack[css-1] : NULL;

    if(_openouters) CloseOuters(&(_stack._vals[last_stackbase]));
    while (last_top >= _top) {
        _stack._vals[last_top--].Null();
    }
}